

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PortDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PortDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PortHeaderSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          PortHeaderSyntax *args_1,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2,
          Token *args_3)

{
  Token semi;
  PortDeclarationSyntax *pPVar1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_RDI;
  BumpAllocator *in_R8;
  PortHeaderSyntax *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  PortDeclarationSyntax *in_stack_00000010;
  undefined2 uStack0000000000000018;
  undefined1 uStack000000000000001a;
  undefined1 uStack000000000000001b;
  undefined4 uStack000000000000001c;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pPVar1 = (PortDeclarationSyntax *)
           allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  semi.info = (Info *)args_3;
  semi.kind = uStack0000000000000018;
  semi._2_1_ = uStack000000000000001a;
  semi.numFlags.raw = uStack000000000000001b;
  semi.rawLen = uStack000000000000001c;
  slang::syntax::PortDeclarationSyntax::PortDeclarationSyntax
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,semi);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }